

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtentBuilder.h
# Opt level: O2

void Parfait::ExtentBuilder::expandExtentWithAnother<double>(Extent<double> *e1,Extent<double> *e2)

{
  double dVar1;
  long lVar2;
  double dVar3;
  
  for (lVar2 = -0x18; lVar2 != 0; lVar2 = lVar2 + 8) {
    dVar3 = *(double *)((long)(e2->hi).pos._M_elems + lVar2);
    dVar1 = *(double *)((long)(e1->hi).pos._M_elems + lVar2);
    if (dVar1 <= dVar3) {
      dVar3 = dVar1;
    }
    *(double *)((long)(e1->hi).pos._M_elems + lVar2) = dVar3;
    dVar3 = *(double *)((long)e2[1].lo.pos._M_elems + lVar2);
    dVar1 = *(double *)((long)e1[1].lo.pos._M_elems + lVar2);
    if (dVar3 <= dVar1) {
      dVar3 = dVar1;
    }
    *(double *)((long)e1[1].lo.pos._M_elems + lVar2) = dVar3;
  }
  return;
}

Assistant:

void expandExtentWithAnother(Extent<T>& e1,const Extent<T>& e2){
            for(int i=0;i<3;i++){
                e1.lo[i] = std::min(e1.lo[i],e2.lo[i]);
                e1.hi[i] = std::max(e1.hi[i],e2.hi[i]);
            }
        }